

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp2.c
# Opt level: O0

void ssh2_bpp_free_incoming_crypto(ssh2_bpp_state *s)

{
  ssh2_bpp_state *s_local;
  
  if ((s->in).mac != (ssh2_mac *)0x0) {
    ssh2_mac_free((s->in).mac);
  }
  if ((s->in).cipher != (ssh_cipher *)0x0) {
    ssh_cipher_free((s->in).cipher);
  }
  if (s->in_decomp != (ssh_decompressor *)0x0) {
    ssh_decompressor_free(s->in_decomp);
  }
  return;
}

Assistant:

static void ssh2_bpp_free_incoming_crypto(struct ssh2_bpp_state *s)
{
    /* As above, take care to free in.mac before in.cipher */
    if (s->in.mac)
        ssh2_mac_free(s->in.mac);
    if (s->in.cipher)
        ssh_cipher_free(s->in.cipher);
    if (s->in_decomp)
        ssh_decompressor_free(s->in_decomp);
}